

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O1

uint __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseHex4<rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,size_t escapeOffset
          )

{
  MemoryStream *pMVar1;
  Ch *pCVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Ch *pCVar6;
  int iVar7;
  int iVar8;
  Ch CVar9;
  
  pMVar1 = is->is_;
  pCVar6 = pMVar1->src_;
  pCVar2 = pMVar1->end_;
  iVar5 = *(int *)(this + 0x30);
  uVar4 = 0;
  iVar7 = 4;
  while( true ) {
    if (pCVar6 == pCVar2) {
      CVar9 = '\0';
    }
    else {
      CVar9 = *pCVar6;
    }
    uVar4 = uVar4 * 0x10 + (int)CVar9;
    iVar8 = -0x30;
    if ((((byte)(CVar9 - 0x30U) < 10) || (iVar8 = -0x37, (byte)(CVar9 + 0xbfU) < 6)) ||
       (iVar8 = -0x57, (byte)(CVar9 + 0x9fU) < 6)) {
      uVar4 = uVar4 + iVar8;
      bVar3 = true;
      if (pCVar6 != pCVar2) {
        pCVar6 = pCVar6 + 1;
        pMVar1->src_ = pCVar6;
      }
    }
    else {
      if (iVar5 != 0) {
        __assert_fail("!HasParseError()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/tkzcfc[P]vpn_uv/common/rapidjson/reader.h"
                      ,0x395,
                      "unsigned int rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseHex4(InputStream &, size_t) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>]"
                     );
      }
      *(undefined4 *)(this + 0x30) = 8;
      *(size_t *)(this + 0x38) = escapeOffset;
      bVar3 = false;
      iVar5 = 8;
    }
    if (!bVar3) break;
    iVar7 = iVar7 + -1;
    if (iVar7 == 0) {
      return uVar4;
    }
  }
  return 0;
}

Assistant:

unsigned ParseHex4(InputStream& is, size_t escapeOffset) {
        unsigned codepoint = 0;
        for (int i = 0; i < 4; i++) {
            Ch c = is.Peek();
            codepoint <<= 4;
            codepoint += static_cast<unsigned>(c);
            if (c >= '0' && c <= '9')
                codepoint -= '0';
            else if (c >= 'A' && c <= 'F')
                codepoint -= 'A' - 10;
            else if (c >= 'a' && c <= 'f')
                codepoint -= 'a' - 10;
            else {
                RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorStringUnicodeEscapeInvalidHex, escapeOffset);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN(0);
            }
            is.Take();
        }
        return codepoint;
    }